

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketFormat.h
# Opt level: O0

bool brynet::net::WebSocketFormat::wsFrameExtractBuffer
               (char *inbuffer,size_t bufferSize,string *payload,WebSocketFrameType *outopcode,
               size_t *frameSize,bool *outfin)

{
  bool bVar1;
  ulong local_68;
  size_t j;
  size_t i;
  uint8_t mask [4];
  uint32_t pos;
  uint32_t payloadlen;
  bool isMasking;
  uchar *buffer;
  bool *outfin_local;
  size_t *frameSize_local;
  WebSocketFrameType *outopcode_local;
  string *payload_local;
  size_t bufferSize_local;
  char *inbuffer_local;
  
  if (bufferSize < 2) {
    return false;
  }
  *outfin = (*inbuffer & 0x80U) != 0;
  *outopcode = (byte)*inbuffer & 0xf;
  bVar1 = (inbuffer[1] & 0x80U) != 0;
  mask = (uint8_t  [4])((byte)inbuffer[1] & 0x7f);
  i._4_4_ = 2;
  if (mask == (uint8_t  [4])0x7e) {
    if (bufferSize < 4) {
      return false;
    }
    mask = (uint8_t  [4])((uint)(byte)inbuffer[2] * 0x100 + (uint)(byte)inbuffer[3]);
    i._4_4_ = 4;
  }
  else if (mask == (uint8_t  [4])0x7f) {
    if (bufferSize < 10) {
      return false;
    }
    if ((((inbuffer[2] != '\0') || (inbuffer[3] != '\0')) || (inbuffer[4] != '\0')) ||
       (inbuffer[5] != '\0')) {
      return false;
    }
    if ((inbuffer[6] & 0x80U) != 0) {
      return false;
    }
    mask = (uint8_t  [4])
           ((uint)(byte)inbuffer[6] * 0x1000000 + (uint)(byte)inbuffer[7] * 0x10000 +
            (uint)(byte)inbuffer[8] * 0x100 + (uint)(byte)inbuffer[9]);
    i._4_4_ = 10;
  }
  if (bVar1) {
    if (bufferSize < i._4_4_ + 4) {
      return false;
    }
    i._4_4_ = i._4_4_ + 4;
  }
  if (bufferSize < i._4_4_ + (int)mask) {
    inbuffer_local._7_1_ = false;
  }
  else {
    if (bVar1) {
      std::__cxx11::string::reserve((ulong)payload);
      for (local_68 = 0; local_68 < (uint)mask; local_68 = local_68 + 1) {
        std::__cxx11::string::push_back((char)payload);
      }
    }
    else {
      std::__cxx11::string::append((char *)payload,(ulong)(inbuffer + i._4_4_));
    }
    *frameSize = (ulong)((int)mask + i._4_4_);
    inbuffer_local._7_1_ = true;
  }
  return inbuffer_local._7_1_;
}

Assistant:

static bool wsFrameExtractBuffer(const char* inbuffer, 
                const size_t bufferSize, 
                std::string& payload, 
                WebSocketFrameType& outopcode, 
                size_t& frameSize, 
                bool& outfin)
            {
                const unsigned char* buffer = (const unsigned char*)inbuffer;

                if (bufferSize < 2)
                {
                    return false;
                }

                outfin = (buffer[0] & 0x80) != 0;
                outopcode = (WebSocketFrameType)(buffer[0] & 0x0F);
                const bool isMasking = (buffer[1] & 0x80) != 0;
                uint32_t payloadlen = buffer[1] & 0x7F;

                uint32_t pos = 2;
                if (payloadlen == 126)
                {
                    if (bufferSize < 4)
                    {
                        return false;
                    }

                    payloadlen = (buffer[2] << 8) + buffer[3];
                    pos = 4;
                }
                else if (payloadlen == 127)
                {
                    if (bufferSize < 10)
                    {
                        return false;
                    }

                    if (buffer[2] != 0 ||
                        buffer[3] != 0 ||
                        buffer[4] != 0 ||
                        buffer[5] != 0)
                    {
                        return false;
                    }

                    if ((buffer[6] & 0x80) != 0)
                    {
                        return false;
                    }

                    payloadlen = (buffer[6] << 24) + (buffer[7] << 16) + (buffer[8] << 8) + buffer[9];
                    pos = 10;
                }

                uint8_t mask[4];
                if (isMasking)
                {
                    if (bufferSize < (pos + 4))
                    {
                        return false;
                    }

                    mask[0] = buffer[pos++];
                    mask[1] = buffer[pos++];
                    mask[2] = buffer[pos++];
                    mask[3] = buffer[pos++];
                }

                if (bufferSize < (pos + payloadlen))
                {
                    return false;
                }

                if (isMasking)
                {
                    payload.reserve(payloadlen);
                    for (size_t i = pos, j = 0; j < payloadlen; i++, j++)
                        payload.push_back(buffer[i] ^ mask[j % 4]);
                }
                else
                {
                    payload.append((const char*)(buffer + pos), payloadlen);
                }

                frameSize = payloadlen + pos;

                return true;
            }